

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_open2(archive *a,void *client_data,undefined1 *client_opener,
                      archive_read_callback *client_reader,archive_skip_callback *client_skipper,
                      undefined1 *client_closer)

{
  int iVar1;
  archive_read *a_1;
  
  archive_read_set_callback_data2(a,client_data,0);
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_set_open_callback");
  if (iVar1 != -0x1e) {
    *(undefined1 **)&a[1].file_count = client_opener;
  }
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_set_read_callback");
  if (iVar1 != -0x1e) {
    a[1].error = (char *)client_reader;
  }
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_set_skip_callback");
  if (iVar1 != -0x1e) {
    a[1].error_string.s = (char *)client_skipper;
  }
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_set_close_callback");
  if (iVar1 != -0x1e) {
    a[1].error_string.buffer_length = (size_t)client_closer;
  }
  iVar1 = archive_read_open1(a);
  return iVar1;
}

Assistant:

int
archive_read_open2(struct archive *a, void *client_data,
    archive_open_callback *client_opener,
    archive_read_callback *client_reader,
    archive_skip_callback *client_skipper,
    archive_close_callback *client_closer)
{
	/* Old archive_read_open2() is just a thin shell around
	 * archive_read_open1. */
	archive_read_set_callback_data(a, client_data);
	archive_read_set_open_callback(a, client_opener);
	archive_read_set_read_callback(a, client_reader);
	archive_read_set_skip_callback(a, client_skipper);
	archive_read_set_close_callback(a, client_closer);
	return archive_read_open1(a);
}